

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RollbackTransaction(Parse *pParse)

{
  int iVar1;
  Vdbe *p;
  char *in_RDI;
  char *unaff_retaddr;
  Vdbe *v;
  Parse *in_stack_00000018;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  Parse *in_stack_fffffffffffffff0;
  
  iVar1 = sqlite3AuthCheck(in_stack_00000018,pParse._4_4_,(char *)v,unaff_retaddr,in_RDI);
  if ((iVar1 == 0) && (p = sqlite3GetVdbe(in_stack_fffffffffffffff0), p != (Vdbe *)0x0)) {
    sqlite3VdbeAddOp2(p,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackTransaction(Parse *pParse){
  Vdbe *v;

  assert( pParse!=0 );
  assert( pParse->db!=0 );
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "ROLLBACK", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3VdbeAddOp2(v, OP_AutoCommit, 1, 1);
  }
}